

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall foxxll::disk_config::disk_config(disk_config *this,string *line)

{
  string *line_local;
  disk_config *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->size = 0;
  std::__cxx11::string::string((string *)&this->io_impl);
  this->autogrow = true;
  this->delete_on_exit = false;
  this->direct = DIRECT_TRY;
  this->flash = false;
  this->queue = -1;
  this->device_id = 0xffffffff;
  this->raw_device = false;
  this->unlink_on_open = false;
  this->queue_length = 0;
  parse_line(this,line);
  return;
}

Assistant:

disk_config::disk_config(const std::string& line)
    : size(0),
      autogrow(true),
      delete_on_exit(false),
      direct(DIRECT_TRY),
      flash(false),
      queue(file::DEFAULT_QUEUE),
      device_id(file::DEFAULT_DEVICE_ID),
      raw_device(false),
      unlink_on_open(false),
      queue_length(0)
{
    parse_line(line);
}